

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O1

string * toml::detail::format_underline
                   (string *__return_storage_ptr__,string *message,
                   vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *loc_com,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *helps,bool colorize)

{
  pointer ppVar1;
  size_t __n;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *lc;
  pointer ppVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  pointer pbVar11;
  char cVar12;
  uint_least32_t uVar13;
  ostream *poVar14;
  ulong uVar15;
  size_t sVar16;
  bool bVar17;
  anon_class_8_1_5e3eab80 format_one_location;
  ostringstream retval;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e8;
  anon_class_8_1_5e3eab80 local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  string *local_1d0;
  long local_1c8 [14];
  ios_base local_158 [80];
  uint auStack_108 [2];
  long alStack_100 [22];
  long *local_50 [2];
  long local_40 [2];
  
  ppVar5 = (loc_com->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (loc_com->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar1) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar13 = (ppVar5->first).line_num_;
      uVar15 = 0;
      if (uVar13 != 0) {
        do {
          uVar15 = uVar15 + 1;
          bVar17 = 9 < uVar13;
          uVar13 = uVar13 / 10;
        } while (bVar17);
      }
      if (uVar15 < uVar10) {
        uVar15 = uVar10;
      }
      uVar10 = uVar15;
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  sVar16 = uVar10 + (uVar10 == 0);
  local_1e8 = loc_com;
  local_1d8 = helps;
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  iVar4 = (int)(ostringstream *)local_1c8;
  if (colorize || color_ansi::detail::color_mode::status()::status_ != '\0') {
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    *(undefined8 *)(lVar6 + 8) = 1;
  }
  if (message->_M_string_length < 8) {
    bVar17 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)message);
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    bVar17 = iVar3 == 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  lVar6 = *(long *)(local_1c8[0] + -0x18);
  iVar3 = (int)lVar6 + iVar4;
  if (bVar17) {
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        (iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[31m",5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    iVar3 = (int)(ostream *)local_1c8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        (iVar3 + (int)lVar6,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
    }
    std::__cxx11::string::substr((ulong)&local_208,(ulong)message);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_208,local_200);
    poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)(poVar14 + 200);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[00m",5);
    }
    local_1e0.line_num_width._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1e0,1);
    if (local_208 != &local_1f8) {
      operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
    }
  }
  else {
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        (iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[31m",5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error] ",8);
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    iVar3 = (int)(ostream *)local_1c8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        (iVar3 + (int)lVar6,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(message->_M_dataplus)._M_p,message->_M_string_length);
    poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)(poVar14 + 200);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[00m",5);
    }
    local_208 = (char *)CONCAT71(local_208._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_208,1);
  }
  local_1e0.line_num_width = sVar16;
  if ((local_1e8->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_1e8->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011d79c:
    __assert_fail("!loc_com.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/source_location.hpp"
                  ,0xbc,
                  "std::string toml::detail::format_underline(const std::string &, const std::vector<std::pair<source_location, std::string>> &, const std::vector<std::string> &, const bool)"
                 );
  }
  lVar6 = *(long *)(local_1c8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
    lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_100 + lVar6);
  }
  else {
    lVar6 = std::ios_base::_M_grow_words
                      ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar6 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
  }
  lVar6 = *(long *)(local_1c8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
    lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_100 + lVar6);
  }
  else {
    lVar6 = std::ios_base::_M_grow_words
                      (iVar4 + (int)lVar6,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar6 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," --> ",5);
  lVar6 = *(long *)(local_1c8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
    lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_100 + lVar6);
  }
  else {
    lVar6 = std::ios_base::_M_grow_words
                      ((int)(ostream *)local_1c8 + (int)lVar6,
                       SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar6 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
  }
  ppVar5 = (local_1e8->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(ppVar5->first).file_name_._M_dataplus._M_p,
                      (ppVar5->first).file_name_._M_string_length);
  local_208 = (char *)CONCAT71(local_208._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_208,1);
  local_208 = &local_1f8;
  lVar6 = sVar16 + 1;
  cVar12 = (char)lVar6;
  if (lVar6 == 0) {
    local_200 = 0;
    local_1f8 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_208,cVar12);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,local_208,local_200);
  poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar8 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar8 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar8 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[01m",5);
  }
  poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar8 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar8 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar8 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," |\n",3);
  poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar8 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar8 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar8 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[00m",5);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  ppVar5 = (local_1e8->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  format_underline::anon_class_8_1_5e3eab80::operator()
            (&local_1e0,(ostringstream *)local_1c8,&ppVar5->first,&ppVar5->second);
  ppVar5 = (local_1e8->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(local_1e8->
                  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4) *
           0x6db6db6db6db6db7;
  if (1 < uVar10) {
    uVar15 = 1;
    lVar8 = 0x70;
    do {
      if (uVar10 <= uVar15 - 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_0011d79c;
      }
      local_208 = (char *)CONCAT71(local_208._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_208,1);
      __n = *(size_t *)((long)ppVar5 + lVar8 + -0x58);
      if ((__n == *(size_t *)((long)&(ppVar5->first).file_name_._M_string_length + lVar8)) &&
         ((__n == 0 ||
          (iVar4 = bcmp(*(void **)((long)ppVar5 + lVar8 + -0x60),
                        *(void **)((long)&(ppVar5->first).file_name_._M_dataplus + lVar8),__n),
          iVar4 == 0)))) {
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
        }
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," ...\n",5);
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
        }
      }
      else {
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
        }
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," --> ",5);
        lVar9 = *(long *)(local_1c8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar9)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_100 + lVar9);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)lVar9 + (int)local_1c8,
                             SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,
                            *(char **)((long)&(ppVar5->first).file_name_._M_dataplus + lVar8),
                            *(long *)((long)&(ppVar5->first).file_name_._M_string_length + lVar8));
        local_208 = (char *)CONCAT71(local_208._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_208,1);
        local_208 = &local_1f8;
        if (lVar6 == 0) {
          local_200 = 0;
          local_1f8 = '\0';
        }
        else {
          std::__cxx11::string::_M_construct((ulong)&local_208,cVar12);
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,local_208,local_200);
        poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[01m",5);
        }
        poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," |\n",3);
        poVar14 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar9 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar9 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar9 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[00m",5);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
        }
      }
      format_underline::anon_class_8_1_5e3eab80::operator()
                (&local_1e0,(ostringstream *)local_1c8,
                 (source_location *)((long)&(ppVar5->first).line_num_ + lVar8),
                 (string *)((long)&(ppVar5->second)._M_dataplus._M_p + lVar8));
      uVar15 = uVar15 + 1;
      ppVar5 = (local_1e8->
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(local_1e8->
                      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4) *
               0x6db6db6db6db6db7;
      lVar8 = lVar8 + 0x70;
    } while (uVar15 < uVar10);
  }
  if ((local_1d8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (local_1d8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_208 = (char *)CONCAT71(local_208._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_208,1);
    local_208 = &local_1f8;
    if (lVar6 == 0) {
      local_200 = 0;
      local_1f8 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct((ulong)&local_208,cVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,local_208,local_200);
    if (local_208 != &local_1f8) {
      operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    iVar4 = (int)(ostream *)local_1c8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
    }
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        (iVar4 + (int)lVar6,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[34m",5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," |",2);
    lVar6 = *(long *)(local_1c8[0] + -0x18);
    iVar4 = (int)(ostream *)local_1c8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
      lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_100 + lVar6);
    }
    else {
      lVar6 = std::ios_base::_M_grow_words
                        ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar6 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
    }
    pbVar2 = (local_1d8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = (local_1d8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
        pbVar11 = pbVar11 + 1) {
      lVar6 = *(long *)(local_1c8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
        lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_100 + lVar6);
      }
      else {
        lVar6 = std::ios_base::_M_grow_words
                          ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar6 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[01m",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\nHint: ",7);
      lVar6 = *(long *)(local_1c8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_108 + lVar6)) {
        lVar6 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_100 + lVar6);
      }
      else {
        lVar6 = std::ios_base::_M_grow_words
                          ((int)lVar6 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar6 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\x1b[00m",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  return local_1d0;
}

Assistant:

inline std::string format_underline(const std::string& message,
        const std::vector<std::pair<source_location, std::string>>& loc_com,
        const std::vector<std::string>& helps = {},
        const bool colorize = TOML11_ERROR_MESSAGE_COLORIZED)
{
    std::size_t line_num_width = 0;
    for(const auto& lc : loc_com)
    {
        std::uint_least32_t line = lc.first.line();
        std::size_t        digit = 0;
        while(line != 0)
        {
            line  /= 10;
            digit +=  1;
        }
        line_num_width = (std::max)(line_num_width, digit);
    }
    // 1 is the minimum width
    line_num_width = std::max<std::size_t>(line_num_width, 1);

    std::ostringstream retval;

    if(color::should_color() || colorize)
    {
        retval << color::colorize; // turn on ANSI color
    }

    // XXX
    // Here, before `colorize` support, it does not output `[error]` prefix
    // automatically. So some user may output it manually and this change may
    // duplicate the prefix. To avoid it, check the first 7 characters and
    // if it is "[error]", it removes that part from the message shown.
    if(message.size() > 7 && message.substr(0, 7) == "[error]")
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error]" << color::reset
#endif
               << color::bold << message.substr(7) << color::reset << '\n';
    }
    else
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error] " << color::reset
#endif
               << color::bold << message << color::reset << '\n';
    }

    const auto format_one_location = [line_num_width]
        (std::ostringstream& oss,
         const source_location& loc, const std::string& comment) -> void
        {
            oss << ' ' << color::bold << color::blue
                << std::setw(static_cast<int>(line_num_width))
                << std::right << loc.line() << " | "  << color::reset
                << loc.line_str() << '\n';

            oss << make_string(line_num_width + 1, ' ')
                << color::bold << color::blue << " | " << color::reset
                << make_string(loc.column()-1 /*1-origin*/, ' ');

            if(loc.region() == 1)
            {
                // invalid
                // ^------
                oss << color::bold << color::red << "^---" << color::reset;
            }
            else
            {
                // invalid
                // ~~~~~~~
                const auto underline_len = (std::min)(
                    static_cast<std::size_t>(loc.region()), loc.line_str().size());
                oss << color::bold << color::red
                    << make_string(underline_len, '~') << color::reset;
            }
            oss << ' ';
            oss << comment;
            return;
        };

    assert(!loc_com.empty());

    // --> example.toml
    //   |
    retval << color::bold << color::blue << " --> " << color::reset
           << loc_com.front().first.file_name() << '\n';
    retval << make_string(line_num_width + 1, ' ')
           << color::bold << color::blue << " |\n"  << color::reset;
    // 1 | key value
    //   |    ^--- missing =
    format_one_location(retval, loc_com.front().first, loc_com.front().second);

    // process the rest of the locations
    for(std::size_t i=1; i<loc_com.size(); ++i)
    {
        const auto& prev = loc_com.at(i-1);
        const auto& curr = loc_com.at(i);

        retval << '\n';
        // if the filenames are the same, print "..."
        if(prev.first.file_name() == curr.first.file_name())
        {
            retval << color::bold << color::blue << " ...\n" << color::reset;
        }
        else // if filename differs, print " --> filename.toml" again
        {
            retval << color::bold << color::blue << " --> " << color::reset
                   << curr.first.file_name() << '\n';
            retval << make_string(line_num_width + 1, ' ')
                   << color::bold << color::blue << " |\n"  << color::reset;
        }

        format_one_location(retval, curr.first, curr.second);
    }

    if(!helps.empty())
    {
        retval << '\n';
        retval << make_string(line_num_width + 1, ' ');
        retval << color::bold << color::blue << " |" << color::reset;
        for(const auto& help : helps)
        {
            retval << color::bold << "\nHint: " << color::reset;
            retval << help;
        }
    }
    return retval.str();
}